

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembly.h
# Opt level: O0

void __thiscall Instruction::Instruction(Instruction *this,string *op,string *name1,string *name2)

{
  string *name2_local;
  string *name1_local;
  string *op_local;
  Instruction *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->op,(string *)op);
  std::__cxx11::string::string((string *)&this->name1,(string *)name1);
  std::__cxx11::string::string((string *)&this->name2,(string *)name2);
  return;
}

Assistant:

Instruction(string op, string name1, string name2): op(op), name1(name1), name2(name2), label()  {}